

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_ManReadArguments(Prs_Man_t *p)

{
  byte bVar1;
  Prs_Ntk_t *pPVar2;
  uint uVar3;
  int iVar4;
  uint Entry;
  int iVar5;
  ulong uVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  byte *pbVar7;
  byte bVar8;
  char *pStart;
  byte *pbVar9;
  char *pError;
  uint uVar10;
  int iVar11;
  undefined4 uVar12;
  Vec_Int_t *vSigsR [3];
  Vec_Int_t *vSigs [3];
  Vec_Int_t *local_68 [4];
  Vec_Int_t *local_48 [3];
  
  pPVar2 = p->pNtk;
  local_48[0] = &pPVar2->vInputs;
  local_48[1] = &pPVar2->vOutputs;
  local_48[2] = &pPVar2->vInouts;
  local_68[0] = &pPVar2->vInputsR;
  local_68[1] = &pPVar2->vOutputsR;
  local_68[2] = &pPVar2->vInoutsR;
  if (*p->pCur != '(') {
    __assert_fail("Prs_ManIsChar(p, \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x477,"int Prs_ManReadArguments(Prs_Man_t *)");
  }
  pbVar9 = (byte *)(p->pCur + 1);
  p->pCur = (char *)pbVar9;
  pbVar7 = (byte *)p->pLimit;
  while (pbVar9 < pbVar7) {
    while( true ) {
      uVar6 = (ulong)*pbVar9;
      if (0x2f < uVar6) goto LAB_003e8f76;
      if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) break;
      pbVar9 = pbVar9 + 1;
      p->pCur = (char *)pbVar9;
    }
    if (uVar6 != 0x2f) {
      if (uVar6 != 0) {
LAB_003e8f76:
        if ((char)uVar6 == ')') {
          return 1;
        }
LAB_003e8f85:
        uVar10 = 0xffffffff;
        iVar4 = 0;
        goto LAB_003e8f94;
      }
      break;
    }
    if (pbVar9[1] == 0x2a) {
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar7 <= pbVar9) {
LAB_003e8f73:
        uVar6 = (ulong)*pbVar9;
        goto LAB_003e8f76;
      }
      while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar7) goto LAB_003e8f73;
      }
      pbVar9 = pbVar9 + 2;
    }
    else {
      if (pbVar9[1] != 0x2f) {
        uVar6 = 0x2f;
        goto LAB_003e8f85;
      }
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar7 <= pbVar9) goto LAB_003e8f73;
      while (bVar8 = *pbVar9, pbVar9 = pbVar9 + 1, bVar8 != 10) {
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar7) goto LAB_003e8f73;
      }
    }
    p->pCur = (char *)pbVar9;
  }
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      uVar12._0_1_ = ' ';
      uVar12._1_1_ = '3';
      uVar12._2_1_ = '0';
      uVar12._3_1_ = '.';
LAB_003e95ac:
      p->ErrorStr[0] = 'E';
      p->ErrorStr[1] = 'r';
      p->ErrorStr[2] = 'r';
      p->ErrorStr[3] = 'o';
      p->ErrorStr[4] = 'r';
      p->ErrorStr[5] = ' ';
      p->ErrorStr[6] = 'n';
      p->ErrorStr[7] = 'u';
      p->ErrorStr[8] = 'm';
      p->ErrorStr[9] = 'b';
      p->ErrorStr[10] = 'e';
      p->ErrorStr[0xb] = 'r';
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar12;
      p->ErrorStr[0x10] = '\0';
      return 0;
    }
  }
LAB_003e96b0:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
LAB_003e8f94:
  bVar8 = (byte)uVar6;
  if (bVar8 == 0x5c) {
    pbVar9 = pbVar9 + 1;
    pbVar7 = pbVar9;
    do {
      p->pCur = (char *)pbVar7;
      bVar1 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (bVar1 != 0x20);
LAB_003e8fe8:
    uVar3 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar9,(char *)(pbVar7 + -1),(int *)0x0);
    if (uVar3 == 0) goto LAB_003e95c4;
    pbVar7 = (byte *)p->pLimit;
    pbVar9 = (byte *)p->pCur;
    while( true ) {
      if (pbVar7 <= pbVar9) goto LAB_003e9480;
      while( true ) {
        uVar6 = (ulong)*pbVar9;
        if (0x2f < uVar6) goto LAB_003e909f;
        if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) break;
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
      }
      if (uVar6 != 0x2f) break;
      if (pbVar9[1] == 0x2a) {
        pbVar9 = pbVar9 + 2;
        p->pCur = (char *)pbVar9;
        if (pbVar7 <= pbVar9) goto LAB_003e909f;
        while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
          pbVar9 = pbVar9 + 1;
          p->pCur = (char *)pbVar9;
          if (pbVar9 == pbVar7) goto LAB_003e909f;
        }
        pbVar9 = pbVar9 + 2;
      }
      else {
        if (pbVar9[1] != 0x2f) goto LAB_003e909f;
        pbVar9 = pbVar9 + 2;
        p->pCur = (char *)pbVar9;
        if (pbVar7 <= pbVar9) goto LAB_003e909f;
        while (bVar1 = *pbVar9, pbVar9 = pbVar9 + 1, bVar1 != 10) {
          p->pCur = (char *)pbVar9;
          if (pbVar9 == pbVar7) goto LAB_003e909f;
        }
      }
      p->pCur = (char *)pbVar9;
    }
    if (uVar6 == 0) goto LAB_003e9480;
LAB_003e909f:
    iVar11 = 0;
    Entry = uVar3;
    iVar5 = extraout_EDX;
    if ((bVar8 == 0x5c) || (3 < uVar3)) goto LAB_003e92d7;
    bVar8 = *pbVar9;
    if (bVar8 != 0x5b) goto LAB_003e9169;
    iVar4 = Prs_ManReadRange(p);
    if (iVar4 != 0) {
      pbVar7 = (byte *)p->pLimit;
      pbVar9 = (byte *)p->pCur;
      do {
        if (pbVar7 <= pbVar9) {
LAB_003e9601:
          if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
          builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
          if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
          uVar12._0_1_ = ' ';
          uVar12._1_1_ = '3';
          uVar12._2_1_ = '4';
          uVar12._3_1_ = '.';
          goto LAB_003e95ac;
        }
        while( true ) {
          bVar8 = *pbVar9;
          uVar6 = (ulong)bVar8;
          if (0x2f < uVar6) goto LAB_003e9169;
          if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) break;
          pbVar9 = pbVar9 + 1;
          p->pCur = (char *)pbVar9;
        }
        if (uVar6 != 0x2f) {
          if (uVar6 == 0) goto LAB_003e9601;
          goto LAB_003e9169;
        }
        if (pbVar9[1] == 0x2a) {
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar7 <= pbVar9) goto LAB_003e9167;
          while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
            pbVar9 = pbVar9 + 1;
            p->pCur = (char *)pbVar9;
            if (pbVar9 == pbVar7) goto LAB_003e9167;
          }
          pbVar9 = pbVar9 + 2;
        }
        else {
          if (pbVar9[1] != 0x2f) {
            bVar8 = 0x2f;
            goto LAB_003e9190;
          }
          pbVar9 = pbVar9 + 2;
          p->pCur = (char *)pbVar9;
          if (pbVar7 <= pbVar9) goto LAB_003e9167;
          while (bVar8 = *pbVar9, pbVar9 = pbVar9 + 1, bVar8 != 10) {
            p->pCur = (char *)pbVar9;
            if (pbVar9 == pbVar7) goto LAB_003e9167;
          }
        }
        p->pCur = (char *)pbVar9;
      } while( true );
    }
    if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
    uVar12._0_1_ = ' ';
    uVar12._1_1_ = '3';
    uVar12._2_1_ = '3';
    uVar12._3_1_ = '.';
  }
  else {
    if ((bVar8 == 0x5f) || (0xe5 < (byte)((bVar8 & 0xdf) + 0xa5))) {
      pbVar7 = pbVar9 + 1;
      do {
        do {
          p->pCur = (char *)pbVar7;
          bVar1 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (0xf5 < (byte)(bVar1 - 0x3a));
      } while (((bVar1 == 0x24) || (bVar1 == 0x5f)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
      goto LAB_003e8fe8;
    }
LAB_003e95c4:
    if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
    uVar12._0_1_ = ' ';
    uVar12._1_1_ = '3';
    uVar12._2_1_ = '1';
    uVar12._3_1_ = '.';
  }
  goto LAB_003e95ac;
LAB_003e9167:
  bVar8 = *pbVar9;
LAB_003e9169:
  if (bVar8 == 0x5c) {
    pbVar9 = pbVar9 + 1;
    pbVar7 = pbVar9;
    do {
      p->pCur = (char *)pbVar7;
      bVar8 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (bVar8 != 0x20);
  }
  else {
LAB_003e9190:
    if ((bVar8 != 0x5f) && ((byte)((bVar8 & 0xdf) + 0xa5) < 0xe6)) goto LAB_003e9654;
    pbVar7 = pbVar9 + 1;
    do {
      do {
        p->pCur = (char *)pbVar7;
        bVar8 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      } while (0xf5 < (byte)(bVar8 - 0x3a));
    } while (((bVar8 == 0x24) || (bVar8 == 0x5f)) || (0xe5 < (byte)((bVar8 & 0xdf) + 0xa5)));
  }
  iVar11 = 0;
  Entry = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar9,(char *)(pbVar7 + -1),(int *)0x0);
  uVar10 = uVar3;
  if (Entry == 0xf) {
    pbVar7 = (byte *)p->pLimit;
    pbVar9 = (byte *)p->pCur;
    do {
      if (pbVar7 <= pbVar9) goto LAB_003e9480;
      while( true ) {
        bVar8 = *pbVar9;
        uVar6 = (ulong)bVar8;
        if (0x2f < uVar6) goto LAB_003e9291;
        if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) break;
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
      }
      if (uVar6 != 0x2f) {
        if (uVar6 == 0) goto LAB_003e9480;
        goto LAB_003e9291;
      }
      if (pbVar9[1] == 0x2a) {
        pbVar9 = pbVar9 + 2;
        p->pCur = (char *)pbVar9;
        if (pbVar7 <= pbVar9) goto LAB_003e928f;
        while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
          pbVar9 = pbVar9 + 1;
          p->pCur = (char *)pbVar9;
          if (pbVar9 == pbVar7) goto LAB_003e928f;
        }
        pbVar9 = pbVar9 + 2;
      }
      else {
        if (pbVar9[1] != 0x2f) goto LAB_003e92bb;
        pbVar9 = pbVar9 + 2;
        p->pCur = (char *)pbVar9;
        if (pbVar7 <= pbVar9) goto LAB_003e928f;
        while (bVar8 = *pbVar9, pbVar9 = pbVar9 + 1, bVar8 != 10) {
          p->pCur = (char *)pbVar9;
          if (pbVar9 == pbVar7) goto LAB_003e928f;
        }
      }
      p->pCur = (char *)pbVar9;
    } while( true );
  }
  iVar5 = extraout_EDX_00;
  if (Entry == 0) {
LAB_003e9654:
    if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
    uVar12._0_1_ = ' ';
    uVar12._1_1_ = '3';
    uVar12._2_1_ = '5';
    uVar12._3_1_ = '.';
    goto LAB_003e95ac;
  }
  goto LAB_003e92d7;
LAB_003e9480:
  if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
  builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
  if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
  uVar12._0_1_ = ' ';
  uVar12._1_1_ = '3';
  uVar12._2_1_ = '2';
  uVar12._3_1_ = '.';
  goto LAB_003e95ac;
LAB_003e928f:
  bVar8 = *pbVar9;
LAB_003e9291:
  if (bVar8 == 0x5b) {
    iVar4 = Prs_ManReadRange(p);
    if (iVar4 == 0) {
      pError = "Error number 33.";
      iVar5 = extraout_EDX_01;
      goto LAB_003e95f7;
    }
    iVar5 = Prs_ManUtilSkipSpaces(p);
    if (iVar5 != 0) {
      pError = "Error number 34.";
      iVar5 = extraout_EDX_02;
      goto LAB_003e95f7;
    }
  }
LAB_003e92bb:
  Entry = Prs_ManReadName(p);
  iVar5 = extraout_EDX_03;
  if (Entry == 0) {
    pError = "Error number 35.";
    goto LAB_003e95f7;
  }
  iVar11 = 1;
LAB_003e92d7:
  if (0 < (int)uVar10) {
    Vec_IntPush(local_48[uVar10 - 1],Entry);
    if (iVar4 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(local_68[uVar10 - 1],iVar11 + iVar4 * 2);
    if (3 < uVar10) {
      __assert_fail("!(Att >> 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x13c,"int Abc_Var2Lit2(int, int)");
    }
    Vec_IntPush(&p->pNtk->vOrder,uVar10 + Entry * 4);
    iVar5 = extraout_EDX_04;
  }
  pbVar7 = (byte *)p->pLimit;
  pbVar9 = (byte *)p->pCur;
  do {
    if (pbVar7 <= pbVar9) {
LAB_003e94cf:
      if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
      uVar12._0_1_ = ' ';
      uVar12._1_1_ = '3';
      uVar12._2_1_ = '6';
      uVar12._3_1_ = '.';
      goto LAB_003e95ac;
    }
    while( true ) {
      bVar8 = *pbVar9;
      uVar6 = (ulong)bVar8;
      if (0x2f < uVar6) goto LAB_003e93c3;
      if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) break;
      pbVar9 = pbVar9 + 1;
      p->pCur = (char *)pbVar9;
    }
    if (uVar6 != 0x2f) {
      if (uVar6 == 0) goto LAB_003e94cf;
      goto LAB_003e93c3;
    }
    if (pbVar9[1] == 0x2a) {
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar7 <= pbVar9) break;
      while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar7) goto LAB_003e93c1;
      }
      pbVar9 = pbVar9 + 2;
    }
    else {
      if (pbVar9[1] != 0x2f) goto LAB_003e95f0;
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar7 <= pbVar9) break;
      while (bVar8 = *pbVar9, pbVar9 = pbVar9 + 1, bVar8 != 10) {
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar7) goto LAB_003e93c1;
      }
    }
    p->pCur = (char *)pbVar9;
  } while( true );
LAB_003e93c1:
  bVar8 = *pbVar9;
LAB_003e93c3:
  if (bVar8 != 0x2c) {
    if (bVar8 == 0x29) {
      return 1;
    }
LAB_003e95f0:
    pError = "Expecting comma in the instance.";
LAB_003e95f7:
    Prs_ManErrorSet(p,pError,iVar5);
    return 0;
  }
  pbVar9 = pbVar9 + 1;
LAB_003e93cf:
  p->pCur = (char *)pbVar9;
  if (pbVar7 <= pbVar9) {
LAB_003e951e:
    if (p->ErrorStr[0] != '\0') goto LAB_003e96b0;
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    pError = "Error number 36.";
    goto LAB_003e95f7;
  }
  while( true ) {
    uVar6 = (ulong)*pbVar9;
    if (0x2f < uVar6) goto LAB_003e946f;
    if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) break;
    pbVar9 = pbVar9 + 1;
    p->pCur = (char *)pbVar9;
  }
  if (uVar6 == 0x2f) {
    if (pbVar9[1] == 0x2a) {
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar7 <= pbVar9) goto LAB_003e946f;
      while ((*pbVar9 != 0x2a || (pbVar9[1] != 0x2f))) {
        pbVar9 = pbVar9 + 1;
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar7) goto LAB_003e946f;
      }
      pbVar9 = pbVar9 + 2;
    }
    else {
      if (pbVar9[1] != 0x2f) goto LAB_003e946f;
      pbVar9 = pbVar9 + 2;
      p->pCur = (char *)pbVar9;
      if (pbVar7 <= pbVar9) goto LAB_003e946f;
      while (bVar8 = *pbVar9, pbVar9 = pbVar9 + 1, bVar8 != 10) {
        p->pCur = (char *)pbVar9;
        if (pbVar9 == pbVar7) goto LAB_003e946f;
      }
    }
    goto LAB_003e93cf;
  }
  if (uVar6 == 0) goto LAB_003e951e;
LAB_003e946f:
  uVar6 = (ulong)*pbVar9;
  goto LAB_003e8f94;
}

Assistant:

static inline int Prs_ManReadArguments( Prs_Man_t * p )
{
    int iRange = 0, iType = -1;
    Vec_Int_t * vSigs[3]  = { &p->pNtk->vInputs,  &p->pNtk->vOutputs,  &p->pNtk->vInouts  };
    Vec_Int_t * vSigsR[3] = { &p->pNtk->vInputsR, &p->pNtk->vOutputsR, &p->pNtk->vInoutsR };
    assert( Prs_ManIsChar(p, '(') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )             return Prs_ManErrorSet(p, "Error number 30.", 0);
    if ( Prs_ManIsChar(p, ')') )
        return 1;
    while ( 1 )
    {
        int fEscape = Prs_ManIsChar(p, '\\');
        int iName = Prs_ManReadName( p );
        int fSigned = 0;
        if ( iName == 0 )                       return Prs_ManErrorSet(p, "Error number 31.", 0);
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 32.", 0);
        if ( iName >= PRS_VER_INPUT && iName <= PRS_VER_INOUT && !fEscape ) // declaration
        {
            iType = iName;
            if ( Prs_ManIsChar(p, '[') )
            {
                iRange = Prs_ManReadRange(p);
                if ( iRange == 0 )              return Prs_ManErrorSet(p, "Error number 33.", 0);
                if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 34.", 0);
            }
            iName = Prs_ManReadName( p );
            if ( iName == 0 )                   return Prs_ManErrorSet(p, "Error number 35.", 0);
            if ( iName == PRS_VER_SIGNED )
            {
                fSigned = 1;
                if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 32.", 0);
                if ( Prs_ManIsChar(p, '[') )
                {
                    iRange = Prs_ManReadRange(p);
                    if ( iRange == 0 )              return Prs_ManErrorSet(p, "Error number 33.", 0);
                    if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 34.", 0);
                }
                iName = Prs_ManReadName( p );
                if ( iName == 0 )               return Prs_ManErrorSet(p, "Error number 35.", 0);
            }
        }
        if ( iType > 0 )
        {
            Vec_IntPush( vSigs[iType - PRS_VER_INPUT], iName );
            Vec_IntPush( vSigsR[iType - PRS_VER_INPUT], Abc_Var2Lit(iRange, fSigned) );
            Vec_IntPush( &p->pNtk->vOrder, Abc_Var2Lit2(iName, iType) );
        }
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 36.", 0);
        if ( Prs_ManIsChar(p, ')') )
            break;
        if ( !Prs_ManIsChar(p, ',') )           return Prs_ManErrorSet(p, "Expecting comma in the instance.", 0);
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 36.", 0);
    }
    // check final
    assert( Prs_ManIsChar(p, ')') );
    return 1;
}